

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogUdp.cpp
# Opt level: O1

void __thiscall liblogger::LogUdp::Log(LogUdp *this,LogType Type,string *str)

{
  pointer pcVar1;
  uint uVar2;
  int iVar3;
  string *psVar4;
  size_t sVar5;
  ostream *poVar6;
  int *piVar7;
  char *pcVar8;
  LogException *pLVar9;
  char *msg;
  time_t current;
  stringstream ss;
  tm timeinfo;
  char buf [128];
  char *local_2a8;
  string local_2a0;
  time_t local_280;
  stringstream local_278 [16];
  long local_268 [14];
  ios_base local_1f8 [264];
  tm local_f0;
  char local_b8 [136];
  
  local_2a8 = (char *)0x0;
  local_280 = time((time_t *)0x0);
  localtime_r(&local_280,&local_f0);
  strftime(local_b8,0x80,"%F %T",&local_f0);
  psVar4 = LogTypeToStr_abi_cxx11_(Type);
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  uVar2 = getpid();
  iVar3 = asprintf(&local_2a8,"%s - %s [PID: %d] - %s\n",local_b8,pcVar1,(ulong)uVar2,
                   (str->_M_dataplus)._M_p);
  pcVar8 = local_2a8;
  if (iVar3 < 0) {
    std::__cxx11::stringstream::stringstream(local_278);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_268,"asprintf failed error:",0x16);
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)(ostream *)local_268 + (int)*(undefined8 *)(local_268[0] + -0x18));
    }
    else {
      sVar5 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,pcVar8,sVar5);
    }
    if (this->m_ignoreerrors != true) {
      pLVar9 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(pLVar9,&local_2a0);
      __cxa_throw(pLVar9,&LogException::typeinfo,LogException::~LogException);
    }
  }
  else {
    sVar5 = strlen(local_2a8);
    iVar3 = (int)sVar5;
    sVar5 = send(this->m_fd,pcVar8,(long)iVar3,0);
    if ((long)sVar5 < 0) {
      std::__cxx11::stringstream::stringstream(local_278);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_268,"write failed error:",0x13);
      piVar7 = __errno_location();
      pcVar8 = strerror(*piVar7);
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)(ostream *)local_268 + (int)*(undefined8 *)(local_268[0] + -0x18));
      }
      else {
        sVar5 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,pcVar8,sVar5);
      }
      free(local_2a8);
      if (this->m_ignoreerrors != true) {
        pLVar9 = (LogException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        LogException::LogException(pLVar9,&local_2a0);
        __cxa_throw(pLVar9,&LogException::typeinfo,LogException::~LogException);
      }
    }
    else {
      if (sVar5 == (long)iVar3) {
        free(local_2a8);
        return;
      }
      std::__cxx11::stringstream::stringstream(local_278);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_268,"Short write only wrote ",0x17);
      poVar6 = std::ostream::_M_insert<long>((long)local_268);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," instead of ",0xc);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," error:",7);
      piVar7 = __errno_location();
      pcVar8 = strerror(*piVar7);
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar8,sVar5);
      }
      free(local_2a8);
      if (this->m_ignoreerrors != true) {
        pLVar9 = (LogException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        LogException::LogException(pLVar9,&local_2a0);
        __cxa_throw(pLVar9,&LogException::typeinfo,LogException::~LogException);
      }
    }
  }
  std::__cxx11::stringstream::~stringstream(local_278);
  std::ios_base::~ios_base(local_1f8);
  return;
}

Assistant:

void LogUdp::Log(const LogType Type, const std::string &str) {
	char *msg = NULL;

	time_t current = time(NULL);
	struct tm timeinfo;
	char buf[128];

	localtime_r(&current, &timeinfo);
	strftime(buf, sizeof(buf), "%F %T", &timeinfo);

	if (asprintf(&msg, "%s - %s [PID: %d] - %s\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
	{
		std::stringstream ss;
		ss << "asprintf failed error:" << strerror(errno);
		if (m_ignoreerrors)
			return;
		throw(LogException(ss.str()));
	}
	else
	{
		int len = strlen(msg);
		ssize_t ret = send(m_fd, msg, len, 0);
		if (ret < 0)
		{
			std::stringstream ss;
			ss << "write failed error:" << strerror(errno);
			free(msg);
			if (m_ignoreerrors)
				return;
			throw(LogException(ss.str()));
		}
		if (ret != len)
		{
			std::stringstream ss;
			ss << "Short write only wrote " << ret << " instead of " << len << " error:" << strerror(errno);
			free(msg);
			if (m_ignoreerrors)
				return;
			throw(LogException(ss.str()));
		}
	}
	free(msg);
}